

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  byte bVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined4 uVar8;
  AABBNodeMB4D *node1;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar45 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar54;
  uint uVar55;
  uint uVar56;
  undefined1 auVar53 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  long local_2638;
  long local_2630;
  ulong local_2628;
  Scene *local_2620;
  undefined1 (*local_2618) [16];
  RTCFilterFunctionNArguments local_2610;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_2590 [16];
  float local_2580 [4];
  float local_2570 [4];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  RTCHitN local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar13;
  
  pauVar18 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar42 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar71 = ZEXT3264(CONCAT428(fVar42,CONCAT424(fVar42,CONCAT420(fVar42,CONCAT416(fVar42,CONCAT412(
                                                  fVar42,CONCAT48(fVar42,CONCAT44(fVar42,fVar42)))))
                                               )));
  fVar46 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23c0._4_4_ = fVar46;
  local_23c0._0_4_ = fVar46;
  local_23c0._8_4_ = fVar46;
  local_23c0._12_4_ = fVar46;
  local_23c0._16_4_ = fVar46;
  local_23c0._20_4_ = fVar46;
  local_23c0._24_4_ = fVar46;
  local_23c0._28_4_ = fVar46;
  auVar45 = ZEXT3264(local_23c0);
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_23e0._4_4_ = fVar47;
  local_23e0._0_4_ = fVar47;
  local_23e0._8_4_ = fVar47;
  local_23e0._12_4_ = fVar47;
  local_23e0._16_4_ = fVar47;
  local_23e0._20_4_ = fVar47;
  local_23e0._24_4_ = fVar47;
  local_23e0._28_4_ = fVar47;
  auVar50 = ZEXT3264(local_23e0);
  fVar42 = fVar42 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar46 = fVar46 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar47 = fVar47 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar23 = uVar20 ^ 0x20;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar28 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_2400._0_8_ = CONCAT44(fVar42,fVar42) ^ 0x8000000080000000;
  local_2400._8_4_ = -fVar42;
  local_2400._12_4_ = -fVar42;
  local_2400._16_4_ = -fVar42;
  local_2400._20_4_ = -fVar42;
  local_2400._24_4_ = -fVar42;
  local_2400._28_4_ = -fVar42;
  auVar53 = ZEXT3264(local_2400);
  local_2420._0_8_ = CONCAT44(fVar46,fVar46) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar46;
  local_2420._12_4_ = -fVar46;
  local_2420._16_4_ = -fVar46;
  local_2420._20_4_ = -fVar46;
  local_2420._24_4_ = -fVar46;
  local_2420._28_4_ = -fVar46;
  auVar58 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar47,fVar47) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar47;
  local_2440._12_4_ = -fVar47;
  local_2440._16_4_ = -fVar47;
  local_2440._20_4_ = -fVar47;
  local_2440._24_4_ = -fVar47;
  local_2440._28_4_ = -fVar47;
  auVar61 = ZEXT3264(local_2440);
  iVar1 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar1;
  local_2460._0_4_ = iVar1;
  local_2460._8_4_ = iVar1;
  local_2460._12_4_ = iVar1;
  local_2460._16_4_ = iVar1;
  local_2460._20_4_ = iVar1;
  local_2460._24_4_ = iVar1;
  local_2460._28_4_ = iVar1;
  auVar64 = ZEXT3264(local_2460);
  local_2618 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_016615b7:
  do {
    do {
      if (pauVar18 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar15 = pauVar18 + -1;
      pauVar18 = pauVar18 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar15 + 8));
    uVar17 = *(ulong *)*pauVar18;
    while ((uVar17 & 8) == 0) {
      uVar9 = uVar17 & 0xfffffffffffffff0;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar35._4_4_ = uVar8;
      auVar35._0_4_ = uVar8;
      auVar35._8_4_ = uVar8;
      auVar35._12_4_ = uVar8;
      auVar35._16_4_ = uVar8;
      auVar35._20_4_ = uVar8;
      auVar35._24_4_ = uVar8;
      auVar35._28_4_ = uVar8;
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar22),auVar35,
                                *(undefined1 (*) [32])(uVar9 + 0x40 + uVar22));
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71._0_32_,auVar53._0_32_);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar20),auVar35,
                                *(undefined1 (*) [32])(uVar9 + 0x40 + uVar20));
      auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar45._0_32_,auVar58._0_32_);
      auVar6 = vpmaxsd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar36));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar21),auVar35,
                                *(undefined1 (*) [32])(uVar9 + 0x40 + uVar21));
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar50._0_32_,auVar61._0_32_);
      auVar7 = vpmaxsd_avx2(ZEXT1632(auVar29),auVar64._0_32_);
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar22 ^ 0x20)),auVar35,
                                *(undefined1 (*) [32])(uVar9 + 0x40 + (uVar22 ^ 0x20)));
      local_25e0 = vpmaxsd_avx2(auVar6,auVar7);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar23),auVar35,
                                *(undefined1 (*) [32])(uVar9 + 0x40 + uVar23));
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71._0_32_,auVar53._0_32_);
      auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar45._0_32_,auVar58._0_32_);
      auVar6 = vpminsd_avx2(ZEXT1632(auVar29),ZEXT1632(auVar36));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar21 ^ 0x20)),auVar35,
                                *(undefined1 (*) [32])(uVar9 + 0x40 + (uVar21 ^ 0x20)));
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar50._0_32_,auVar61._0_32_);
      auVar7 = vpminsd_avx2(ZEXT1632(auVar29),auVar28._0_32_);
      auVar6 = vpminsd_avx2(auVar6,auVar7);
      auVar6 = vcmpps_avx(local_25e0,auVar6,2);
      if (((uint)uVar17 & 7) == 6) {
        auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar9 + 0x1c0),auVar35,2);
        auVar35 = vcmpps_avx(auVar35,*(undefined1 (*) [32])(uVar9 + 0x1e0),1);
        auVar7 = vandps_avx(auVar7,auVar35);
        auVar6 = vandps_avx(auVar7,auVar6);
        auVar29 = vpackssdw_avx(auVar6._0_16_,auVar6._16_16_);
      }
      else {
        auVar29 = vpackssdw_avx(auVar6._0_16_,auVar6._16_16_);
      }
      auVar29 = vpsllw_avx(auVar29,0xf);
      if ((((((((auVar29 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar29 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar29 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar29 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf])
      goto LAB_016615b7;
      auVar29 = vpacksswb_avx(auVar29,auVar29);
      bVar5 = SUB161(auVar29 >> 7,0) & 1 | (SUB161(auVar29 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar29 >> 0x17,0) & 1) << 2 | (SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar29 >> 0x27,0) & 1) << 4 | (SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar29 >> 0x37,0) & 1) << 6 | SUB161(auVar29 >> 0x3f,0) << 7;
      lVar10 = 0;
      for (uVar17 = (ulong)bVar5; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
        lVar10 = lVar10 + 1;
      }
      uVar17 = *(ulong *)(uVar9 + lVar10 * 8);
      uVar12 = bVar5 - 1 & (uint)bVar5;
      uVar13 = (ulong)uVar12;
      if (uVar12 != 0) {
        uVar54 = *(uint *)(local_25e0 + lVar10 * 4);
        lVar10 = 0;
        for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          lVar10 = lVar10 + 1;
        }
        uVar12 = uVar12 - 1 & uVar12;
        uVar14 = (ulong)uVar12;
        uVar13 = *(ulong *)(uVar9 + lVar10 * 8);
        uVar55 = *(uint *)(local_25e0 + lVar10 * 4);
        if (uVar12 == 0) {
          if (uVar54 < uVar55) {
            *(ulong *)*pauVar18 = uVar13;
            *(uint *)(*pauVar18 + 8) = uVar55;
            pauVar18 = pauVar18 + 1;
          }
          else {
            *(ulong *)*pauVar18 = uVar17;
            *(uint *)(*pauVar18 + 8) = uVar54;
            pauVar18 = pauVar18 + 1;
            uVar17 = uVar13;
          }
        }
        else {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar17;
          auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar54));
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar13;
          auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar55));
          lVar10 = 0;
          for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar10 = lVar10 + 1;
          }
          uVar12 = uVar12 - 1 & uVar12;
          uVar17 = (ulong)uVar12;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(uVar9 + lVar10 * 8);
          auVar30 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_25e0 + lVar10 * 4)));
          auVar38 = vpcmpgtd_avx(auVar36,auVar29);
          if (uVar12 == 0) {
            auVar39 = vpshufd_avx(auVar38,0xaa);
            auVar38 = vblendvps_avx(auVar36,auVar29,auVar39);
            auVar29 = vblendvps_avx(auVar29,auVar36,auVar39);
            auVar36 = vpcmpgtd_avx(auVar30,auVar38);
            auVar39 = vpshufd_avx(auVar36,0xaa);
            auVar36 = vblendvps_avx(auVar30,auVar38,auVar39);
            auVar38 = vblendvps_avx(auVar38,auVar30,auVar39);
            auVar30 = vpcmpgtd_avx(auVar38,auVar29);
            auVar39 = vpshufd_avx(auVar30,0xaa);
            auVar30 = vblendvps_avx(auVar38,auVar29,auVar39);
            auVar29 = vblendvps_avx(auVar29,auVar38,auVar39);
            *pauVar18 = auVar29;
            pauVar18[1] = auVar30;
            uVar17 = auVar36._0_8_;
            pauVar18 = pauVar18 + 2;
          }
          else {
            lVar10 = 0;
            for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar10 = lVar10 + 1;
            }
            uVar12 = uVar12 - 1 & uVar12;
            uVar17 = (ulong)uVar12;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = *(ulong *)(uVar9 + lVar10 * 8);
            auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_25e0 + lVar10 * 4)));
            if (uVar12 == 0) {
              auVar44 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar36,auVar29,auVar44);
              auVar29 = vblendvps_avx(auVar29,auVar36,auVar44);
              auVar36 = vpcmpgtd_avx(auVar39,auVar30);
              auVar44 = vpshufd_avx(auVar36,0xaa);
              auVar36 = vblendvps_avx(auVar39,auVar30,auVar44);
              auVar30 = vblendvps_avx(auVar30,auVar39,auVar44);
              auVar39 = vpcmpgtd_avx(auVar30,auVar29);
              auVar44 = vpshufd_avx(auVar39,0xaa);
              auVar39 = vblendvps_avx(auVar30,auVar29,auVar44);
              auVar29 = vblendvps_avx(auVar29,auVar30,auVar44);
              auVar30 = vpcmpgtd_avx(auVar36,auVar38);
              auVar44 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar36,auVar38,auVar44);
              auVar36 = vblendvps_avx(auVar38,auVar36,auVar44);
              auVar38 = vpcmpgtd_avx(auVar39,auVar36);
              auVar44 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar39,auVar36,auVar44);
              auVar36 = vblendvps_avx(auVar36,auVar39,auVar44);
              *pauVar18 = auVar29;
              pauVar18[1] = auVar36;
              pauVar18[2] = auVar38;
              pauVar18 = pauVar18 + 3;
              uVar17 = auVar30._0_8_;
            }
            else {
              *pauVar18 = auVar29;
              pauVar18[1] = auVar36;
              pauVar18[2] = auVar30;
              pauVar15 = pauVar18 + 3;
              pauVar18[3] = auVar39;
              do {
                lVar10 = 0;
                for (uVar13 = uVar17; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar10 = lVar10 + 1;
                }
                auVar30._8_8_ = 0;
                auVar30._0_8_ = *(ulong *)(uVar9 + lVar10 * 8);
                auVar29 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_25e0 + lVar10 * 4)));
                pauVar15[1] = auVar29;
                pauVar15 = pauVar15 + 1;
                uVar17 = uVar17 - 1 & uVar17;
              } while (uVar17 != 0);
              lVar10 = 0;
              while (pauVar15 != pauVar18) {
                auVar29 = pauVar18[1];
                uVar12 = vextractps_avx(auVar29,2);
                for (lVar19 = 0x10;
                    (lVar10 != lVar19 && (*(uint *)(pauVar18[-1] + lVar19 + 8) < uVar12));
                    lVar19 = lVar19 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar18 + lVar19) =
                       *(undefined1 (*) [16])(pauVar18[-1] + lVar19);
                }
                *(undefined1 (*) [16])(*pauVar18 + lVar19) = auVar29;
                lVar10 = lVar10 + -0x10;
                pauVar18 = pauVar18 + 1;
              }
              uVar17 = *(ulong *)*pauVar15;
              pauVar18 = pauVar15;
            }
          }
        }
      }
    }
    lVar10 = (ulong)((uint)uVar17 & 0xf) - 8;
    uVar17 = uVar17 & 0xfffffffffffffff0;
    for (lVar19 = 0; lVar19 != lVar10; lVar19 = lVar19 + 1) {
      lVar16 = lVar19 * 0x140;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar24._4_4_ = uVar8;
      auVar24._0_4_ = uVar8;
      auVar24._8_4_ = uVar8;
      auVar24._12_4_ = uVar8;
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x90 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + lVar16));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xa0 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + 0x10 + lVar16));
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xb0 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + 0x20 + lVar16));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xc0 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + 0x30 + lVar16));
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xd0 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + 0x40 + lVar16));
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xe0 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + 0x50 + lVar16));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xf0 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + 0x60 + lVar16));
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x100 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + 0x70 + lVar16));
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x110 + lVar16),auVar24,
                                *(undefined1 (*) [16])(uVar17 + 0x80 + lVar16));
      auVar36 = vsubps_avx(auVar37,auVar29);
      auVar29 = vsubps_avx(auVar41,auVar38);
      auVar38 = vsubps_avx(auVar32,auVar30);
      auVar30 = vsubps_avx(auVar39,auVar37);
      auVar39 = vsubps_avx(auVar44,auVar41);
      auVar44 = vsubps_avx(auVar24,auVar32);
      auVar25._0_4_ = auVar44._0_4_ * auVar29._0_4_;
      auVar25._4_4_ = auVar44._4_4_ * auVar29._4_4_;
      auVar25._8_4_ = auVar44._8_4_ * auVar29._8_4_;
      auVar25._12_4_ = auVar44._12_4_ * auVar29._12_4_;
      local_2550 = vfmsub231ps_fma(auVar25,auVar39,auVar38);
      auVar31._0_4_ = auVar38._0_4_ * auVar30._0_4_;
      auVar31._4_4_ = auVar38._4_4_ * auVar30._4_4_;
      auVar31._8_4_ = auVar38._8_4_ * auVar30._8_4_;
      auVar31._12_4_ = auVar38._12_4_ * auVar30._12_4_;
      local_2540 = vfmsub231ps_fma(auVar31,auVar44,auVar36);
      uVar8 = *(undefined4 *)(ray + k * 4);
      auVar62._4_4_ = uVar8;
      auVar62._0_4_ = uVar8;
      auVar62._8_4_ = uVar8;
      auVar62._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar65._4_4_ = uVar8;
      auVar65._0_4_ = uVar8;
      auVar65._8_4_ = uVar8;
      auVar65._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar68._4_4_ = uVar8;
      auVar68._0_4_ = uVar8;
      auVar68._8_4_ = uVar8;
      auVar68._12_4_ = uVar8;
      fVar42 = *(float *)(ray + k * 4 + 0x40);
      auVar57._4_4_ = fVar42;
      auVar57._0_4_ = fVar42;
      auVar57._8_4_ = fVar42;
      auVar57._12_4_ = fVar42;
      auVar37 = vsubps_avx(auVar37,auVar62);
      fVar46 = *(float *)(ray + k * 4 + 0x50);
      auVar63._4_4_ = fVar46;
      auVar63._0_4_ = fVar46;
      auVar63._8_4_ = fVar46;
      auVar63._12_4_ = fVar46;
      auVar41 = vsubps_avx(auVar41,auVar65);
      fVar47 = *(float *)(ray + k * 4 + 0x60);
      auVar66._4_4_ = fVar47;
      auVar66._0_4_ = fVar47;
      auVar66._8_4_ = fVar47;
      auVar66._12_4_ = fVar47;
      auVar32 = vsubps_avx(auVar32,auVar68);
      auVar69._0_4_ = fVar42 * auVar41._0_4_;
      auVar69._4_4_ = fVar42 * auVar41._4_4_;
      auVar69._8_4_ = fVar42 * auVar41._8_4_;
      auVar69._12_4_ = fVar42 * auVar41._12_4_;
      auVar24 = vfmsub231ps_fma(auVar69,auVar37,auVar63);
      auVar59._0_4_ = auVar44._0_4_ * auVar24._0_4_;
      auVar59._4_4_ = auVar44._4_4_ * auVar24._4_4_;
      auVar59._8_4_ = auVar44._8_4_ * auVar24._8_4_;
      auVar59._12_4_ = auVar44._12_4_ * auVar24._12_4_;
      auVar70._0_4_ = auVar38._0_4_ * auVar24._0_4_;
      auVar70._4_4_ = auVar38._4_4_ * auVar24._4_4_;
      auVar70._8_4_ = auVar38._8_4_ * auVar24._8_4_;
      auVar70._12_4_ = auVar38._12_4_ * auVar24._12_4_;
      auVar51._0_4_ = fVar47 * auVar37._0_4_;
      auVar51._4_4_ = fVar47 * auVar37._4_4_;
      auVar51._8_4_ = fVar47 * auVar37._8_4_;
      auVar51._12_4_ = fVar47 * auVar37._12_4_;
      auVar44 = vfmsub231ps_fma(auVar51,auVar32,auVar57);
      auVar38 = vfmadd231ps_fma(auVar59,auVar44,auVar39);
      auVar44 = vfmadd231ps_fma(auVar70,auVar29,auVar44);
      auVar49._0_4_ = auVar39._0_4_ * auVar36._0_4_;
      auVar49._4_4_ = auVar39._4_4_ * auVar36._4_4_;
      auVar49._8_4_ = auVar39._8_4_ * auVar36._8_4_;
      auVar49._12_4_ = auVar39._12_4_ * auVar36._12_4_;
      local_2530 = vfmsub231ps_fma(auVar49,auVar30,auVar29);
      auVar43._0_4_ = fVar46 * auVar32._0_4_;
      auVar43._4_4_ = fVar46 * auVar32._4_4_;
      auVar43._8_4_ = fVar46 * auVar32._8_4_;
      auVar43._12_4_ = fVar46 * auVar32._12_4_;
      auVar24 = vfmsub231ps_fma(auVar43,auVar41,auVar66);
      auVar67._0_4_ = local_2530._0_4_ * fVar47;
      auVar67._4_4_ = local_2530._4_4_ * fVar47;
      auVar67._8_4_ = local_2530._8_4_ * fVar47;
      auVar67._12_4_ = local_2530._12_4_ * fVar47;
      auVar29 = vfmadd231ps_fma(auVar67,local_2540,auVar63);
      auVar39 = vfmadd231ps_fma(auVar29,local_2550,auVar57);
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar38 = vfmadd231ps_fma(auVar38,auVar24,auVar30);
      auVar29 = vandps_avx(auVar39,auVar52);
      uVar12 = auVar29._0_4_;
      local_25e0._0_4_ = (float)(uVar12 ^ auVar38._0_4_);
      uVar54 = auVar29._4_4_;
      local_25e0._4_4_ = (float)(uVar54 ^ auVar38._4_4_);
      uVar55 = auVar29._8_4_;
      local_25e0._8_4_ = (float)(uVar55 ^ auVar38._8_4_);
      uVar56 = auVar29._12_4_;
      local_25e0._12_4_ = (float)(uVar56 ^ auVar38._12_4_);
      auVar29 = vfmadd231ps_fma(auVar44,auVar36,auVar24);
      local_25e0._16_4_ = (float)(uVar12 ^ auVar29._0_4_);
      local_25e0._20_4_ = (float)(uVar54 ^ auVar29._4_4_);
      local_25e0._24_4_ = (float)(uVar55 ^ auVar29._8_4_);
      local_25e0._28_4_ = (float)(uVar56 ^ auVar29._12_4_);
      auVar38 = ZEXT816(0) << 0x20;
      auVar29 = vcmpps_avx(local_25e0._0_16_,auVar38,5);
      auVar36 = vcmpps_avx(local_25e0._16_16_,auVar38,5);
      auVar29 = vandps_avx(auVar36,auVar29);
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      local_25b0 = vandps_avx(auVar39,auVar44);
      auVar36 = vcmpps_avx(auVar39,auVar38,4);
      auVar29 = vandps_avx(auVar29,auVar36);
      auVar60._0_4_ = local_25e0._0_4_ + local_25e0._16_4_;
      auVar60._4_4_ = local_25e0._4_4_ + local_25e0._20_4_;
      auVar60._8_4_ = local_25e0._8_4_ + local_25e0._24_4_;
      auVar60._12_4_ = local_25e0._12_4_ + local_25e0._28_4_;
      auVar36 = vcmpps_avx(auVar60,local_25b0,2);
      auVar38 = auVar36 & auVar29;
      if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar38[0xf] < '\0'
         ) {
        auVar29 = vandps_avx(auVar29,auVar36);
        auVar40._0_4_ = local_2530._0_4_ * auVar32._0_4_;
        auVar40._4_4_ = local_2530._4_4_ * auVar32._4_4_;
        auVar40._8_4_ = local_2530._8_4_ * auVar32._8_4_;
        auVar40._12_4_ = local_2530._12_4_ * auVar32._12_4_;
        auVar36 = vfmadd213ps_fma(auVar41,local_2540,auVar40);
        auVar36 = vfmadd213ps_fma(auVar37,local_2550,auVar36);
        local_25c0._0_4_ = (float)(uVar12 ^ auVar36._0_4_);
        local_25c0._4_4_ = (float)(uVar54 ^ auVar36._4_4_);
        local_25c0._8_4_ = (float)(uVar55 ^ auVar36._8_4_);
        local_25c0._12_4_ = (float)(uVar56 ^ auVar36._12_4_);
        fVar42 = *(float *)(ray + k * 4 + 0x30);
        auVar37._0_4_ = local_25b0._0_4_ * fVar42;
        auVar37._4_4_ = local_25b0._4_4_ * fVar42;
        auVar37._8_4_ = local_25b0._8_4_ * fVar42;
        auVar37._12_4_ = local_25b0._12_4_ * fVar42;
        auVar36 = vcmpps_avx(auVar37,local_25c0,1);
        fVar42 = *(float *)(ray + k * 4 + 0x80);
        auVar28 = ZEXT1664(CONCAT412(fVar42,CONCAT48(fVar42,CONCAT44(fVar42,fVar42))));
        auVar41._0_4_ = fVar42 * local_25b0._0_4_;
        auVar41._4_4_ = fVar42 * local_25b0._4_4_;
        auVar41._8_4_ = fVar42 * local_25b0._8_4_;
        auVar41._12_4_ = fVar42 * local_25b0._12_4_;
        auVar38 = vcmpps_avx(local_25c0,auVar41,2);
        auVar36 = vandps_avx(auVar36,auVar38);
        auVar38 = auVar29 & auVar36;
        if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar38[0xf] < '\0') {
          local_2670 = vandps_avx(auVar29,auVar36);
          local_2590 = local_2670;
          local_2620 = context->scene;
          auVar29 = vrcpps_avx(local_25b0);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar36 = vfnmadd213ps_fma(local_25b0,auVar29,auVar32);
          auVar29 = vfmadd132ps_fma(auVar36,auVar29,auVar29);
          fVar42 = auVar29._0_4_;
          local_2560._0_4_ = fVar42 * local_25c0._0_4_;
          fVar46 = auVar29._4_4_;
          local_2560._4_4_ = fVar46 * local_25c0._4_4_;
          fVar47 = auVar29._8_4_;
          local_2560._8_4_ = fVar47 * local_25c0._8_4_;
          fVar48 = auVar29._12_4_;
          local_2560._12_4_ = fVar48 * local_25c0._12_4_;
          auVar45 = ZEXT1664(local_2560);
          local_2580[0] = fVar42 * local_25e0._0_4_;
          local_2580[1] = fVar46 * local_25e0._4_4_;
          local_2580[2] = fVar47 * local_25e0._8_4_;
          local_2580[3] = fVar48 * local_25e0._12_4_;
          auVar33._8_4_ = 0x7f800000;
          auVar33._0_8_ = 0x7f8000007f800000;
          auVar33._12_4_ = 0x7f800000;
          auVar29 = vblendvps_avx(auVar33,local_2560,local_2670);
          local_2570[0] = fVar42 * local_25e0._16_4_;
          local_2570[1] = fVar46 * local_25e0._20_4_;
          local_2570[2] = fVar47 * local_25e0._24_4_;
          local_2570[3] = fVar48 * local_25e0._28_4_;
          auVar36 = vshufps_avx(auVar29,auVar29,0xb1);
          auVar36 = vminps_avx(auVar36,auVar29);
          auVar38 = vshufpd_avx(auVar36,auVar36,1);
          auVar36 = vminps_avx(auVar38,auVar36);
          auVar29 = vcmpps_avx(auVar29,auVar36,0);
          auVar38 = local_2670 & auVar29;
          auVar36 = vpcmpeqd_avx(auVar36,auVar36);
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar36 = auVar29;
          }
          lVar16 = lVar16 + uVar17;
          auVar29 = vandps_avx(local_2670,auVar36);
          uVar8 = vmovmskps_avx(auVar29);
          lVar11 = 0;
          for (uVar9 = CONCAT44((int)((ulong)local_2620 >> 0x20),uVar8); (uVar9 & 1) == 0;
              uVar9 = uVar9 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          do {
            local_2660 = auVar28._0_16_;
            uVar12 = *(uint *)(lVar16 + 0x120 + lVar11 * 4);
            pGVar3 = (local_2620->geometries).items[uVar12].ptr;
            if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_2670 + lVar11 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar42 = local_2580[lVar11];
                fVar46 = local_2570[lVar11];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2560 + lVar11 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2550 + lVar11 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2540 + lVar11 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2530 + lVar11 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar42;
                *(float *)(ray + k * 4 + 0x100) = fVar46;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar16 + 0x130 + lVar11 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar12;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              local_2520 = auVar45._0_16_;
              local_2480 = auVar71._0_32_;
              fVar42 = local_2580[lVar11];
              local_24e0._4_4_ = fVar42;
              local_24e0._0_4_ = fVar42;
              local_24e0._8_4_ = fVar42;
              local_24e0._12_4_ = fVar42;
              local_24d0 = local_2570[lVar11];
              local_24b0._4_4_ = uVar12;
              local_24b0._0_4_ = uVar12;
              local_24b0._8_4_ = uVar12;
              local_24b0._12_4_ = uVar12;
              local_24c0 = *(undefined4 *)(lVar16 + 0x130 + lVar11 * 4);
              uVar8 = *(undefined4 *)(local_2550 + lVar11 * 4);
              uVar2 = *(undefined4 *)(local_2540 + lVar11 * 4);
              local_2500._4_4_ = uVar2;
              local_2500._0_4_ = uVar2;
              local_2500._8_4_ = uVar2;
              local_2500._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_2530 + lVar11 * 4);
              local_24f0._4_4_ = uVar2;
              local_24f0._0_4_ = uVar2;
              local_24f0._8_4_ = uVar2;
              local_24f0._12_4_ = uVar2;
              local_2510[0] = (RTCHitN)(char)uVar8;
              local_2510[1] = (RTCHitN)(char)((uint)uVar8 >> 8);
              local_2510[2] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
              local_2510[3] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
              local_2510[4] = (RTCHitN)(char)uVar8;
              local_2510[5] = (RTCHitN)(char)((uint)uVar8 >> 8);
              local_2510[6] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
              local_2510[7] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
              local_2510[8] = (RTCHitN)(char)uVar8;
              local_2510[9] = (RTCHitN)(char)((uint)uVar8 >> 8);
              local_2510[10] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
              local_2510[0xb] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
              local_2510[0xc] = (RTCHitN)(char)uVar8;
              local_2510[0xd] = (RTCHitN)(char)((uint)uVar8 >> 8);
              local_2510[0xe] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
              local_2510[0xf] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
              fStack_24cc = local_24d0;
              fStack_24c8 = local_24d0;
              fStack_24c4 = local_24d0;
              uStack_24bc = local_24c0;
              uStack_24b8 = local_24c0;
              uStack_24b4 = local_24c0;
              vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
              uStack_249c = context->user->instID[0];
              local_24a0 = uStack_249c;
              uStack_2498 = uStack_249c;
              uStack_2494 = uStack_249c;
              uStack_2490 = context->user->instPrimID[0];
              uStack_248c = uStack_2490;
              uStack_2488 = uStack_2490;
              uStack_2484 = uStack_2490;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2560 + lVar11 * 4);
              local_2650 = *local_2618;
              local_2610.valid = (int *)local_2650;
              local_2610.geometryUserPtr = pGVar3->userPtr;
              local_2610.context = context->user;
              local_2610.hit = local_2510;
              local_2610.N = 4;
              local_2638 = lVar19;
              local_2630 = lVar10;
              local_2628 = uVar20;
              local_2610.ray = (RTCRayN *)ray;
              if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar3->intersectionFilterN)(&local_2610);
              }
              if (local_2650 == (undefined1  [16])0x0) {
                auVar29 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar29 = auVar29 ^ _DAT_01f46b70;
              }
              else {
                p_Var4 = context->args->filter;
                if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var4)(&local_2610);
                }
                auVar36 = vpcmpeqd_avx(local_2650,_DAT_01f45a50);
                auVar29 = auVar36 ^ _DAT_01f46b70;
                if (local_2650 != (undefined1  [16])0x0) {
                  auVar36 = auVar36 ^ _DAT_01f46b70;
                  auVar38 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])local_2610.hit);
                  *(undefined1 (*) [16])(local_2610.ray + 0xc0) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_2610.hit + 0x10));
                  *(undefined1 (*) [16])(local_2610.ray + 0xd0) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_2610.hit + 0x20));
                  *(undefined1 (*) [16])(local_2610.ray + 0xe0) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_2610.hit + 0x30));
                  *(undefined1 (*) [16])(local_2610.ray + 0xf0) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_2610.hit + 0x40));
                  *(undefined1 (*) [16])(local_2610.ray + 0x100) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_2610.hit + 0x50));
                  *(undefined1 (*) [16])(local_2610.ray + 0x110) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_2610.hit + 0x60));
                  *(undefined1 (*) [16])(local_2610.ray + 0x120) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_2610.hit + 0x70));
                  *(undefined1 (*) [16])(local_2610.ray + 0x130) = auVar38;
                  auVar36 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_2610.hit + 0x80));
                  *(undefined1 (*) [16])(local_2610.ray + 0x140) = auVar36;
                }
              }
              auVar26._8_8_ = 0x100000001;
              auVar26._0_8_ = 0x100000001;
              if ((auVar26 & auVar29) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_2660._0_4_;
              }
              else {
                local_2660 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_2670 + lVar11 * 4) = 0;
              auVar28 = ZEXT1664(local_2660);
              uVar8 = local_2660._0_4_;
              auVar27._4_4_ = uVar8;
              auVar27._0_4_ = uVar8;
              auVar27._8_4_ = uVar8;
              auVar27._12_4_ = uVar8;
              auVar45 = ZEXT1664(local_2520);
              auVar29 = vcmpps_avx(local_2520,auVar27,2);
              local_2670 = vandps_avx(auVar29,local_2670);
              auVar71 = ZEXT3264(local_2480);
              lVar10 = local_2630;
              lVar19 = local_2638;
              uVar20 = local_2628;
            }
            if ((((local_2670 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_2670 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_2670 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_2670[0xf]) break;
            auVar34._8_4_ = 0x7f800000;
            auVar34._0_8_ = 0x7f8000007f800000;
            auVar34._12_4_ = 0x7f800000;
            auVar29 = vblendvps_avx(auVar34,auVar45._0_16_,local_2670);
            auVar36 = vshufps_avx(auVar29,auVar29,0xb1);
            auVar36 = vminps_avx(auVar36,auVar29);
            auVar38 = vshufpd_avx(auVar36,auVar36,1);
            auVar36 = vminps_avx(auVar38,auVar36);
            auVar36 = vcmpps_avx(auVar29,auVar36,0);
            auVar38 = local_2670 & auVar36;
            auVar29 = local_2670;
            if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar38[0xf] < '\0') {
              auVar29 = vandps_avx(auVar36,local_2670);
            }
            uVar9 = (ulong)lVar11 >> 0x20;
            uVar8 = vmovmskps_avx(auVar29);
            lVar11 = 0;
            for (uVar9 = CONCAT44((int)uVar9,uVar8); (uVar9 & 1) == 0;
                uVar9 = uVar9 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
          } while( true );
        }
      }
      auVar45 = ZEXT3264(local_23c0);
      auVar50 = ZEXT3264(local_23e0);
      auVar53 = ZEXT3264(local_2400);
      auVar58 = ZEXT3264(local_2420);
      auVar61 = ZEXT3264(local_2440);
      auVar64 = ZEXT3264(local_2460);
    }
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar28 = ZEXT3264(CONCAT428(uVar8,CONCAT424(uVar8,CONCAT420(uVar8,CONCAT416(uVar8,CONCAT412(
                                                  uVar8,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }